

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O1

void __thiscall icu_63::Norms::Norms(Norms *this,UErrorCode *errorCode)

{
  UMutableCPTrie *pUVar1;
  UToolMemory *mem;
  Norm *pNVar2;
  
  UnicodeSet::UnicodeSet(&this->ccSet);
  UnicodeSet::UnicodeSet(&this->mappingSet);
  pUVar1 = umutablecptrie_open_63(0,0,errorCode);
  this->normTrie = pUVar1;
  mem = utm_open("gennorm2 normalization structs",10000,0x110100,0x40);
  this->normMem = mem;
  pNVar2 = (Norm *)utm_alloc(mem);
  utm_getStart(this->normMem);
  this->norms = pNVar2;
  pNVar2->type = INERT;
  return;
}

Assistant:

Norms::Norms(UErrorCode &errorCode) {
    normTrie = umutablecptrie_open(0, 0, &errorCode);
    normMem=utm_open("gennorm2 normalization structs", 10000, 0x110100, sizeof(Norm));
    // Default "inert" Norm struct at index 0. Practically immutable.
    norms=allocNorm();
    norms->type=Norm::INERT;
}